

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::draw_line_c4(uchar *pixels,int w,int h,int stride,int x0,int y0,int x1,int y1,uint color,
                       int thickness)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  
  fVar11 = (float)thickness * 0.5;
  iVar2 = y1;
  iVar1 = y0;
  if (y1 < y0) {
    iVar2 = y0;
    iVar1 = y1;
  }
  if ((float)(int)((float)iVar1 - fVar11) < (float)iVar2 + fVar11) {
    iVar3 = (int)((float)iVar1 - fVar11);
    iVar7 = x1;
    iVar1 = x0;
    if (x1 < x0) {
      iVar7 = x0;
      iVar1 = x1;
    }
    iVar10 = (int)((float)iVar1 - fVar11);
    iVar12 = x1 - x0;
    iVar13 = y1 - y0;
    lVar8 = (long)iVar3;
    iVar3 = (iVar10 - x0) * iVar12 + (iVar3 - y0) * iVar13;
    do {
      if (-1 < lVar8) {
        if (h <= lVar8) {
          return;
        }
        if ((float)(int)((float)iVar1 - fVar11) < (float)iVar7 + fVar11) {
          lVar5 = lVar8 * stride;
          uVar4 = iVar10 * 4;
          iVar6 = iVar3;
          iVar9 = iVar10;
          do {
            if (-1 < iVar9) {
              if (w <= iVar9) break;
              fVar14 = (float)iVar6 * (1.0 / (float)(iVar13 * iVar13 + iVar12 * iVar12));
              if (((0.0 <= fVar14) && (fVar14 <= 1.0)) &&
                 (fVar15 = (float)iVar9 - (fVar14 * (float)iVar12 + (float)x0),
                 fVar14 = (float)(int)lVar8 - (fVar14 * (float)iVar13 + (float)y0),
                 fVar14 * fVar14 + fVar15 * fVar15 < fVar11)) {
                pixels[(ulong)uVar4 + lVar5] = (uchar)color;
                pixels[(ulong)(uVar4 + 1) + lVar5] = (uchar)(color >> 8);
                pixels[(ulong)(uVar4 + 2) + lVar5] = (uchar)(color >> 0x10);
                pixels[(ulong)(uVar4 + 3) + lVar5] = (uchar)(color >> 0x18);
              }
            }
            iVar9 = iVar9 + 1;
            uVar4 = uVar4 + 4;
            iVar6 = iVar6 + iVar12;
          } while ((float)iVar9 < (float)iVar7 + fVar11);
        }
      }
      lVar8 = lVar8 + 1;
      iVar3 = iVar3 + iVar13;
    } while ((float)(int)lVar8 < (float)iVar2 + fVar11);
  }
  return;
}

Assistant:

void draw_line_c4(unsigned char* pixels, int w, int h, int stride, int x0, int y0, int x1, int y1, unsigned int color, int thickness)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    const float t0 = thickness / 2.f;
    const float t1 = thickness - t0;

    int x_min = std::min(x0, x1);
    int x_max = std::max(x0, x1);
    int y_min = std::min(y0, y1);
    int y_max = std::max(y0, y1);

    for (int y = y_min - t0; y < y_max + t1; y++)
    {
        if (y < 0)
            continue;

        if (y >= h)
            break;

        unsigned char* p = pixels + stride * y;

        for (int x = x_min - t0; x < x_max + t1; x++)
        {
            if (x < 0)
                continue;

            if (x >= w)
                break;

            // distance from line
            if (distance_lessthan(x, y, x0, y0, x1, y1, t1))
            {
                p[x * 4 + 0] = pen_color[0];
                p[x * 4 + 1] = pen_color[1];
                p[x * 4 + 2] = pen_color[2];
                p[x * 4 + 3] = pen_color[3];
            }
        }
    }
}